

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O0

uint32_t ans_msb_mapping(uint32_t x)

{
  uint32_t x_local;
  undefined4 local_4;
  
  local_4 = x;
  if (0x100 < x) {
    if (x < 0x10001) {
      local_4 = (x >> 8) + 0x100;
    }
    else if (x < 0x1000001) {
      local_4 = (x >> 0x10) + 0x200;
    }
    else {
      local_4 = (x >> 0x18) + 0x300;
    }
  }
  return local_4;
}

Assistant:

uint32_t ans_msb_mapping(uint32_t x)
{
    if (x <= 256)
        return x;
    if (x <= (1 << 16))
        return (x >> 8) + 256;
    if (x <= (1 << 24))
        return (x >> 16) + 512;
    return (x >> 24) + 768;
}